

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  int idx;
  ImDrawList *pIVar6;
  ImGuiTableColumn *pIVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  
  table->CurrentColumn = column_n;
  pIVar7 = (table->Columns).Data + column_n;
  if ((table->Columns).DataEnd <= pIVar7) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
  }
  pIVar2 = table->InnerWindow;
  fVar10 = (&pIVar7->StartXRows)[(byte)table->field_0x94 & 1];
  if ((pIVar7->Flags & 0x4000) != 0) {
    fVar10 = fVar10 + table->RowIndentOffsetX;
  }
  (pIVar2->DC).CursorPos.x = fVar10;
  fVar9 = table->RowPosY1 + table->CellPaddingY;
  (pIVar2->DC).CursorPos.y = fVar9;
  (pIVar2->DC).CursorMaxPos.x = fVar10;
  (pIVar2->DC).ColumnsOffset.x = (fVar10 - (pIVar2->Pos).x) - (pIVar2->DC).Indent.x;
  (pIVar2->DC).CurrLineTextBaseOffset = table->RowTextBaseline;
  (pIVar2->DC).LastItemId = 0;
  (pIVar2->WorkRect).Min.y = fVar9;
  (pIVar2->WorkRect).Min.x = pIVar7->MinX + table->CellPaddingX1;
  (pIVar2->WorkRect).Max.x = pIVar7->MaxX - table->CellPaddingX2;
  if (pIVar7->IsVisible == false) {
    uVar8 = -(uint)(table->RowPosY2 <= fVar9);
    (pIVar2->DC).CursorPos.y = (float)(~uVar8 & (uint)table->RowPosY2 | (uint)fVar9 & uVar8);
  }
  pIVar2->SkipItems = pIVar7->SkipItems;
  if ((table->Flags & 0x4000) == 0) {
    IVar3 = (pIVar7->ClipRect).Min;
    IVar4 = (pIVar7->ClipRect).Max;
    IVar5 = (pIVar7->ClipRect).Max;
    (pIVar2->ClipRect).Min = (pIVar7->ClipRect).Min;
    (pIVar2->ClipRect).Max = IVar5;
    pIVar6 = pIVar2->DrawList;
    (pIVar6->_CmdHeader).ClipRect.x = IVar3.x;
    (pIVar6->_CmdHeader).ClipRect.y = IVar3.y;
    (pIVar6->_CmdHeader).ClipRect.z = IVar4.x;
    (pIVar6->_CmdHeader).ClipRect.w = IVar4.y;
    pIVar1 = (pIVar2->DrawList->_ClipRectStack).Data +
             (long)(pIVar2->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar3.x;
    pIVar1->y = IVar3.y;
    pIVar1->z = IVar4.x;
    pIVar1->w = IVar4.y;
    pIVar6 = pIVar2->DrawList;
    idx = (int)pIVar7->DrawChannelCurrent;
  }
  else {
    pIVar6 = pIVar2->DrawList;
    idx = 1;
  }
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar6,idx);
  return;
}

Assistant:

void    ImGui::TableBeginCell(ImGuiTable* table, int column_n)
{
    table->CurrentColumn = column_n;
    ImGuiTableColumn* column = &table->Columns[column_n];
    ImGuiWindow* window = table->InnerWindow;

    // Start position is roughly ~~ CellRect.Min + CellPadding + Indent
    float start_x = (table->RowFlags & ImGuiTableRowFlags_Headers) ? column->StartXHeaders : column->StartXRows;
    if (column->Flags & ImGuiTableColumnFlags_IndentEnable)
        start_x += table->RowIndentOffsetX; // ~~ += window.DC.Indent.x - table->HostIndentX, except we locked it for the row.

    window->DC.CursorPos.x = start_x;
    window->DC.CursorPos.y = table->RowPosY1 + table->CellPaddingY;
    window->DC.CursorMaxPos.x = window->DC.CursorPos.x;
    window->DC.ColumnsOffset.x = start_x - window->Pos.x - window->DC.Indent.x; // FIXME-WORKRECT
    window->DC.CurrLineTextBaseOffset = table->RowTextBaseline;
    window->DC.LastItemId = 0;

    window->WorkRect.Min.y = window->DC.CursorPos.y;
    window->WorkRect.Min.x = column->MinX + table->CellPaddingX1;
    window->WorkRect.Max.x = column->MaxX - table->CellPaddingX2;

    // To allow ImGuiListClipper to function we propagate our row height
    if (!column->IsVisible)
        window->DC.CursorPos.y = ImMax(window->DC.CursorPos.y, table->RowPosY2);

    window->SkipItems = column->SkipItems;
    if (table->Flags & ImGuiTableFlags_NoClipX)
    {
        table->DrawSplitter.SetCurrentChannel(window->DrawList, 1);
    }
    else
    {
        SetWindowClipRectBeforeSetChannel(window, column->ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
    }
}